

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O2

int cfttree(int n,int j,int k,double *a,int nw,double *w)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)n;
  if ((k & 3U) == 0) {
    for (; (k & 3U) == 0; k = k >> 2) {
      uVar2 = (ulong)(uint)((int)uVar2 << 2);
    }
    if ((k & 1U) != 0) {
      while (uVar1 = (uint)uVar2, 0x80 < (int)uVar1) {
        cftmdl1(uVar1,a + (int)(j - uVar1),w + (nw - (int)(uVar2 >> 1)));
        uVar2 = (ulong)(uVar1 >> 2);
      }
      return k & 1;
    }
    while (uVar1 = (uint)uVar2, 0x80 < (int)uVar1) {
      cftmdl2(uVar1,a + (int)(j - uVar1),w + (int)(nw - uVar1));
      uVar2 = (ulong)(uVar1 >> 2);
    }
  }
  else {
    if ((k & 1U) != 0) {
      cftmdl1(n,a + (j - n),w + (nw - (n >> 1)));
      return 1;
    }
    cftmdl2(n,a + (j - n),w + (nw - n));
  }
  return 0;
}

Assistant:

int cfttree(int n, int j, int k, double *a, int nw, double *w) {
  void cftmdl1(int n, double *a, double *w);
  void cftmdl2(int n, double *a, double *w);
  int i, isplt, m;

  if ((k & 3) != 0) {
    isplt = k & 1;
    if (isplt != 0) {
      cftmdl1(n, &a[j - n], &w[nw - (n >> 1)]);
    } else {
      cftmdl2(n, &a[j - n], &w[nw - n]);
    }
  } else {
    m = n;
    for (i = k; (i & 3) == 0; i >>= 2) {
      m <<= 2;
    }
    isplt = i & 1;
    if (isplt != 0) {
      while (m > 128) {
        cftmdl1(m, &a[j - m], &w[nw - (m >> 1)]);
        m >>= 2;
      }
    } else {
      while (m > 128) {
        cftmdl2(m, &a[j - m], &w[nw - m]);
        m >>= 2;
      }
    }
  }
  return isplt;
}